

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O2

shared_ptr<Storage::Data::ZX8081::File> __thiscall
Storage::Data::ZX8081::FileFromData
          (ZX8081 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  ushort uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar6;
  ulong uVar7;
  shared_ptr<Storage::Data::ZX8081::File> sVar8;
  shared_ptr<Storage::Data::ZX8081::File> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> name_data;
  wstring local_50;
  
  name_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  name_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  name_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar5 = 0xb;
  for (uVar6 = uVar5;
      uVar4 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3, uVar6 < uVar4;
      uVar6 = uVar6 - 1) {
    if (uVar6 == 0) goto LAB_003d0af4;
    local_50._M_dataplus._M_p._0_1_ = puVar3[uVar7] & 0x3f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&name_data,(uchar *)&local_50);
    puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((char)puVar3[uVar7] < '\0') {
      uVar6 = uVar6 - 1;
      break;
    }
    uVar7 = uVar7 + 1;
  }
  if (uVar6 != 0) {
    uVar4 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3;
    uVar5 = uVar7;
LAB_003d0af4:
    if ((uVar5 + 0x56 <= uVar4) && ((*(ushort *)(puVar3 + uVar5 + 0xc) + uVar5) - 0x4008 <= uVar4))
    {
      std::make_shared<Storage::Data::ZX8081::File>();
      StringFromData_abi_cxx11_
                (&local_50,(ZX8081 *)&name_data,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1,SUB81(uVar4,0));
      std::__cxx11::wstring::operator=
                ((wstring *)
                 &(result.
                   super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->name,(wstring *)&local_50);
      std::__cxx11::wstring::~wstring((wstring *)&local_50);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(result.
                   super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->data,data);
      (result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      isZX81 = true;
      goto LAB_003d0b21;
    }
  }
  result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_003d0b21:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&name_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  _Var2 = result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  if (result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3;
    if ((((uVar5 < 0x28) || (uVar1 = *(ushort *)(puVar3 + 10), uVar5 < (ulong)uVar1 - 0x4000)) ||
        (uVar1 < *(ushort *)(puVar3 + 8))) || (*(ushort *)(puVar3 + 0xc) < uVar1)) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
    }
    else {
      std::make_shared<Storage::Data::ZX8081::File>();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)this,data);
      *(undefined1 *)(*(long *)this + 0x38) = 0;
    }
  }
  else {
    *(element_type **)this =
         result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
    result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar8.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar8.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Data::ZX8081::File>)
         sVar8.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<File> Storage::Data::ZX8081::FileFromData(const std::vector<uint8_t> &data) {
	std::shared_ptr<Storage::Data::ZX8081::File> result = ZX81FileFromData(data);
	if(result) return result;
	return ZX80FileFromData(data);
}